

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_switches.cpp
# Opt level: O0

void __thiscall FTextureManager::ProcessSwitchDef(FTextureManager *this,FScanner *sc)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  bool local_41;
  EGameType local_40;
  FTextureID FStack_3c;
  bool quest;
  int gametype;
  FTextureID picnum;
  FSwitchDef *def2;
  FSwitchDef *def1;
  FString picname;
  BITFIELD texflags;
  FScanner *sc_local;
  FTextureManager *this_local;
  
  picname.Chars._4_4_ = 3;
  FString::FString((FString *)&def1);
  FTextureID::FTextureID(&stack0xffffffffffffffc4);
  local_41 = false;
  _gametype = (FSwitchDef *)0x0;
  def2 = (FSwitchDef *)0x0;
  FScanner::MustGetString(sc);
  bVar1 = FScanner::Compare(sc,"doom");
  if (bVar1) {
    local_40 = GAME_DoomChex;
    FScanner::CheckNumber(sc);
  }
  else {
    bVar1 = FScanner::Compare(sc,"heretic");
    if (bVar1) {
      local_40 = GAME_Heretic;
    }
    else {
      bVar1 = FScanner::Compare(sc,"hexen");
      if (bVar1) {
        local_40 = GAME_Hexen;
      }
      else {
        bVar1 = FScanner::Compare(sc,"strife");
        if (bVar1) {
          local_40 = GAME_Strife;
        }
        else {
          bVar1 = FScanner::Compare(sc,"any");
          if (!bVar1) {
            FScanner::UnGet(sc);
          }
          local_40 = GAME_Any;
        }
      }
    }
  }
  FScanner::MustGetString(sc);
  FStack_3c = CheckForTexture(this,sc->String,1,3);
  FString::operator=((FString *)&def1,sc->String);
LAB_00830917:
  do {
    bVar1 = FScanner::GetString(sc);
    if (!bVar1) {
LAB_00830a7b:
      if (((def2 == (FSwitchDef *)0x0) ||
          (bVar1 = FTextureID::Exists(&stack0xffffffffffffffc4), !bVar1)) ||
         ((local_40 != GAME_Any && ((local_40 & gameinfo.gametype) == GAME_Any)))) {
        if (_gametype != (FSwitchDef *)0x0) {
          M_Free(_gametype);
        }
        if (def2 != (FSwitchDef *)0x0) {
          M_Free(def2);
        }
      }
      else {
        if (_gametype == (FSwitchDef *)0x0) {
          _gametype = (FSwitchDef *)
                      M_Malloc_Dbg(0x20,
                                   "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/textures/anim_switches.cpp"
                                   ,0xc9);
          _gametype->Sound = def2->Sound;
          _gametype->NumFrames = 1;
          _gametype->frames[0].TimeMin = 0;
          _gametype->frames[0].TimeRnd = 0;
          _gametype->frames[0].Texture.texnum = FStack_3c.texnum;
        }
        (def2->PreTexture).texnum = FStack_3c.texnum;
        (_gametype->PreTexture).texnum = def2->frames[(ulong)def2->NumFrames - 1].Texture.texnum;
        bVar1 = FTextureID::operator==(&def2->PreTexture,&_gametype->PreTexture);
        if (bVar1) {
          pcVar2 = FString::GetChars((FString *)&def1);
          pcVar3 = FString::GetChars((FString *)&def1);
          FScanner::ScriptError
                    (sc,"The on state for switch %s must end with a texture other than %s",pcVar2,
                     pcVar3);
        }
        AddSwitchPair(this,def2,_gametype);
        _gametype->QuestPanel = local_41;
        def2->QuestPanel = local_41;
      }
      FString::~FString((FString *)&def1);
      return;
    }
    bVar1 = FScanner::Compare(sc,"quest");
    if (!bVar1) {
      bVar1 = FScanner::Compare(sc,"on");
      if (bVar1) {
        if (def2 != (FSwitchDef *)0x0) {
          FScanner::ScriptError(sc,"Switch already has an on state");
        }
        bVar1 = FTextureID::Exists(&stack0xffffffffffffffc4);
        def2 = ParseSwitchDef(this,sc,(bool)(~bVar1 & 1));
      }
      else {
        bVar1 = FScanner::Compare(sc,"off");
        if (!bVar1) {
          FScanner::UnGet(sc);
          goto LAB_00830a7b;
        }
        if (_gametype != (FSwitchDef *)0x0) {
          FScanner::ScriptError(sc,"Switch already has an off state");
        }
        bVar1 = FTextureID::Exists(&stack0xffffffffffffffc4);
        _gametype = ParseSwitchDef(this,sc,(bool)(~bVar1 & 1));
      }
      goto LAB_00830917;
    }
    local_41 = true;
  } while( true );
}

Assistant:

void FTextureManager::ProcessSwitchDef (FScanner &sc)
{
	const BITFIELD texflags = TEXMAN_Overridable | TEXMAN_TryAny;
	FString picname;
	FSwitchDef *def1, *def2;
	FTextureID picnum;
	int gametype;
	bool quest = false;

	def1 = def2 = NULL;
	sc.MustGetString ();
	if (sc.Compare ("doom"))
	{
		gametype = GAME_DoomChex;
		sc.CheckNumber();	// skip the gamemission filter
	}
	else if (sc.Compare ("heretic"))
	{
		gametype = GAME_Heretic;
	}
	else if (sc.Compare ("hexen"))
	{
		gametype = GAME_Hexen;
	}
	else if (sc.Compare ("strife"))
	{
		gametype = GAME_Strife;
	}
	else if (sc.Compare ("any"))
	{
		gametype = GAME_Any;
	}
	else
	{
		// There is no game specified; just treat as any
		//max = 240;
		gametype = GAME_Any;
		sc.UnGet ();
	}

	sc.MustGetString ();
	picnum = CheckForTexture (sc.String, FTexture::TEX_Wall, texflags);
	picname = sc.String;
	while (sc.GetString ())
	{
		if (sc.Compare ("quest"))
		{
			quest = true;
		}
		else if (sc.Compare ("on"))
		{
			if (def1 != NULL)
			{
				sc.ScriptError ("Switch already has an on state");
			}
			def1 = ParseSwitchDef (sc, !picnum.Exists());
		}
		else if (sc.Compare ("off"))
		{
			if (def2 != NULL)
			{
				sc.ScriptError ("Switch already has an off state");
			}
			def2 = ParseSwitchDef (sc, !picnum.Exists());
		}
		else
		{
			sc.UnGet ();
			break;
		}
	}

	if (def1 == NULL || !picnum.Exists() ||
		(gametype != GAME_Any && !(gametype & gameinfo.gametype)))
	{
		if (def2 != NULL)
		{
			M_Free (def2);
		}
		if (def1 != NULL)
		{
			M_Free (def1);
		}
		return;
	}

	// If the switch did not have an off state, create one that just returns
	// it to the original texture without doing anything interesting
	if (def2 == NULL)
	{
		def2 = (FSwitchDef *)M_Malloc (sizeof(FSwitchDef));
		def2->Sound = def1->Sound;
		def2->NumFrames = 1;
		def2->frames[0].TimeMin = 0;
		def2->frames[0].TimeRnd = 0;
		def2->frames[0].Texture = picnum;
	}

	def1->PreTexture = picnum;
	def2->PreTexture = def1->frames[def1->NumFrames-1].Texture;
	if (def1->PreTexture == def2->PreTexture)
	{
		sc.ScriptError ("The on state for switch %s must end with a texture other than %s", picname.GetChars(), picname.GetChars());
	}
	AddSwitchPair(def1, def2);
	def1->QuestPanel = def2->QuestPanel = quest;
}